

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

void __thiscall
Rml::ElementText::OnPropertyChange(ElementText *this,PropertyIdSet *changed_properties)

{
  float fVar1;
  Colourb CVar2;
  ColourbPremultiplied CVar3;
  Geometry *pGVar4;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *this_00;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  StableVectorIndex SVar10;
  uint uVar11;
  ComputedValues *pCVar12;
  ulong uVar13;
  ulong uVar14;
  RenderManager *pRVar15;
  ColourbPremultiplied *pCVar16;
  uint uVar17;
  Vector<Vertex> *__range4;
  uint uVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar23;
  undefined1 auVar22 [16];
  float fVar24;
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  Mesh mesh;
  Mesh local_68;
  RenderManager *local_38;
  StableVectorIndex local_30;
  undefined1 auVar21 [16];
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  pCVar12 = Element::GetComputedValues(&this->super_Element);
  if ((((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x100000000000) == 0) &&
     ((*(byte *)((long)(changed_properties->defined_ids).super__Base_bitset<2UL>._M_w + 9) & 2) == 0
     )) {
    bVar6 = false;
  }
  else {
    fVar1 = (pCVar12->inherited).opacity;
    CVar2 = (pCVar12->inherited).color;
    fVar24 = (float)((uint)CVar2 >> 0x18) * fVar1;
    iVar19 = (int)fVar24;
    fVar24 = fVar24 / 255.0;
    uVar11 = (uint)((float)((uint)CVar2 & 0xff) * fVar24);
    uVar18 = (uint)((float)((uint)CVar2 >> 8 & 0xff) * fVar24);
    uVar17 = (uint)((float)((uint)CVar2 >> 0x10 & 0xff) * fVar24);
    if (((this->colour).red == (uchar)uVar11) &&
       ((((this->colour).green == (uchar)uVar18 && ((this->colour).blue == (uchar)uVar17)) &&
        ((this->colour).alpha == (uchar)iVar19)))) {
      bVar6 = false;
    }
    else {
      this->colour = (ColourbPremultiplied)
                     (uVar11 & 0xff | (uVar18 & 0xff) << 8 |
                     (uVar17 & 0xff) << 0x10 | iVar19 << 0x18);
      bVar6 = true;
    }
    if ((this->opacity != fVar1) || (NAN(this->opacity) || NAN(fVar1))) {
      this->opacity = fVar1;
      this->font_effects_dirty = true;
      this->field_0x1ec = this->field_0x1ec | 1;
    }
  }
  if ((((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0xf800000000000) == 0)
     && (uVar13 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[1],
        (uVar13 & 0x300000000) == 0)) {
    bVar5 = false;
  }
  else {
    ::std::
    vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
    ::_M_erase_at_end(&this->geometry,
                      (this->geometry).
                      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    this->field_0x1ec = this->field_0x1ec | 1;
    this->font_effects_handle = 0;
    this->font_effects_dirty = true;
    this->font_handle_version = 0;
    uVar13 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[1];
    bVar5 = true;
  }
  if (((uint)uVar13 >> 0xe & 1) != 0) {
    this->font_effects_dirty = true;
  }
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x20000000000000) != 0) {
    uVar11 = *(uint *)&(pCVar12->inherited).field_0x14 >> 0x12;
    this->decoration_property = (TextDecoration)uVar11 & LineThrough;
    pGVar4 = (this->decoration)._M_t.
             super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
             super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl;
    if ((pGVar4 != (Geometry *)0x0) && ((uVar11 & 3) == 0)) {
      (this->decoration)._M_t.
      super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
      super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl = (Geometry *)0x0;
      ::std::default_delete<Rml::Geometry>::operator()
                ((default_delete<Rml::Geometry> *)&this->decoration,pGVar4);
    }
  }
  if (bVar5) {
    if ((this->field_0x1ec & 2) != 0) {
      Element::DirtyLayout(&this->super_Element);
      return;
    }
  }
  else if (bVar6) {
    this->field_0x1ec = this->field_0x1ec | 1;
    pGVar4 = (this->decoration)._M_t.
             super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
             super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl;
    if (pGVar4 != (Geometry *)0x0) {
      Geometry::Release(&local_68,pGVar4,ReturnMesh);
      auVar9 = _DAT_002d5190;
      auVar8 = _DAT_002d5180;
      auVar7 = _DAT_002cf160;
      if (local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        CVar3 = this->colour;
        uVar13 = (long)local_68.vertices.
                       super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-0x14 - (long)local_68.vertices.
                                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar13;
        uVar20 = SUB164(auVar26 * ZEXT816(0xcccccccccccccccd),8);
        uVar23 = (undefined4)(uVar13 / 0x140000000);
        auVar21._0_8_ = CONCAT44(uVar23,uVar20);
        auVar21._8_4_ = uVar20;
        auVar21._12_4_ = uVar23;
        auVar22._0_8_ = auVar21._0_8_ >> 4;
        auVar22._8_8_ = auVar21._8_8_ >> 4;
        pCVar16 = &local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                   _M_impl.super__Vector_impl_data._M_start[3].colour;
        uVar14 = 0;
        auVar22 = auVar22 ^ _DAT_002cf160;
        do {
          auVar25._8_4_ = (int)uVar14;
          auVar25._0_8_ = uVar14;
          auVar25._12_4_ = (int)(uVar14 >> 0x20);
          auVar26 = (auVar25 | auVar9) ^ auVar7;
          iVar19 = auVar22._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar19 && auVar22._0_4_ < auVar26._0_4_ ||
                      iVar19 < auVar26._4_4_) & 1)) {
            pCVar16[-0xf] = CVar3;
          }
          if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
              auVar26._12_4_ <= auVar22._12_4_) {
            pCVar16[-10] = CVar3;
          }
          auVar26 = (auVar25 | auVar8) ^ auVar7;
          iVar27 = auVar26._4_4_;
          if (iVar27 <= iVar19 && (iVar27 != iVar19 || auVar26._0_4_ <= auVar22._0_4_)) {
            pCVar16[-5] = CVar3;
            *pCVar16 = CVar3;
          }
          uVar14 = uVar14 + 4;
          pCVar16 = pCVar16 + 0x14;
        } while ((uVar13 / 0x14 + 4 & 0xfffffffffffffffc) != uVar14);
      }
      pRVar15 = Element::GetRenderManager(&this->super_Element);
      if (pRVar15 != (RenderManager *)0x0) {
        RenderManager::MakeGeometry((RenderManager *)&stack0xffffffffffffffc8,(Mesh *)pRVar15);
        this_00 = &((this->decoration)._M_t.
                    super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
                    super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl)->
                   super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ;
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::ReleaseInDerived(this_00);
        SVar10 = local_30;
        pRVar15 = local_38;
        local_38 = (RenderManager *)0x0;
        this_00->render_manager = pRVar15;
        local_30 = Invalid;
        this_00->resource_handle = SVar10;
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                            *)&stack0xffffffffffffffc8);
      }
      if (local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.vertices.
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void ElementText::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;

	Element::OnPropertyChange(changed_properties);

	bool colour_changed = false;
	bool font_face_changed = false;
	auto& computed = GetComputedValues();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::Opacity))
	{
		const float new_opacity = computed.opacity();
		const bool opacity_changed = opacity != new_opacity;

		ColourbPremultiplied new_colour = computed.color().ToPremultiplied(new_opacity);
		colour_changed = colour != new_colour;

		if (colour_changed)
		{
			colour = new_colour;
		}
		if (opacity_changed)
		{
			opacity = new_opacity;
			font_effects_dirty = true;
			geometry_dirty = true;
		}
	}

	if (changed_properties.Contains(PropertyId::FontFamily) ||     //
		changed_properties.Contains(PropertyId::FontWeight) ||     //
		changed_properties.Contains(PropertyId::FontStyle) ||      //
		changed_properties.Contains(PropertyId::FontSize) ||       //
		changed_properties.Contains(PropertyId::LetterSpacing) ||  //
		changed_properties.Contains(PropertyId::RmlUi_Language) || //
		changed_properties.Contains(PropertyId::RmlUi_Direction))
	{
		font_face_changed = true;

		geometry.clear();
		geometry_dirty = true;

		font_effects_handle = 0;
		font_effects_dirty = true;
		font_handle_version = 0;
	}

	if (changed_properties.Contains(PropertyId::FontEffect))
	{
		font_effects_dirty = true;
	}

	if (changed_properties.Contains(PropertyId::TextDecoration))
	{
		decoration_property = computed.text_decoration();
		if (decoration && decoration_property == Style::TextDecoration::None)
			decoration.reset();
	}

	if (font_face_changed)
	{
		// We have to let our document know we need to be regenerated.
		if (dirty_layout_on_change)
			DirtyLayout();
	}
	else if (colour_changed)
	{
		// Force the geometry to be regenerated.
		geometry_dirty = true;

		// Re-colour the decoration geometry.
		if (decoration)
		{
			Mesh mesh = decoration->Release();
			for (Vertex& vertex : mesh.vertices)
				vertex.colour = colour;

			if (RenderManager* render_manager = GetRenderManager())
				*decoration = render_manager->MakeGeometry(std::move(mesh));
		}
	}
}